

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sys_psx_Thread.cpp
# Opt level: O0

bool __thiscall axl::sys::psx::Thread::join(Thread *this,void **retVal)

{
  int iVar1;
  void **in_RSI;
  pthread_t *in_RDI;
  int result;
  uint_t in_stack_ffffffffffffffcc;
  ErrorRef *in_stack_ffffffffffffffd0;
  bool local_1;
  
  if ((in_RDI[1] & 1) == 0) {
    local_1 = true;
  }
  else {
    iVar1 = pthread_join(*in_RDI,in_RSI);
    if (iVar1 == 0) {
      *(undefined1 *)(in_RDI + 1) = 0;
      local_1 = true;
    }
    else {
      err::ErrorRef::ErrorRef(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
      local_1 = err::fail((ErrorRef *)0x1a934f);
      err::ErrorRef::~ErrorRef((ErrorRef *)0x1a9369);
    }
  }
  return local_1;
}

Assistant:

bool
Thread::join(void** retVal) {
	if (!m_isOpen)
		return true;

	int result = ::pthread_join(m_threadId, retVal);
	if (result != 0)
		return err::fail(result);

	m_isOpen = false;
	return true;
}